

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamEuler::GetField_dt(ChElementBeamEuler *this,ChVectorDynamic<> *mD_dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  element_type *peVar6;
  double *pdVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  void *pvVar14;
  undefined8 *puVar15;
  uint uVar16;
  ulong uVar17;
  double *pdVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  ulong local_40;
  double local_38;
  ulong local_30;
  
  pdVar18 = (mD_dt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  if ((mD_dt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      0xc) {
    if (pdVar18 != (double *)0x0) {
      free((void *)pdVar18[-1]);
    }
    pvVar14 = malloc(0xa0);
    if (pvVar14 == (void *)0x0) {
      puVar15 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar15 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(void **)(((ulong)pvVar14 & 0xffffffffffffffc0) + 0x38) = pvVar14;
    pdVar18 = (double *)(((ulong)pvVar14 & 0xffffffffffffffc0) + 0x40);
    (mD_dt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         pdVar18;
  }
  (mD_dt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0xc;
  auVar24 = ZEXT816(0xbff0000000000000);
  auVar38 = ZEXT816(0x4000000000000000);
  uVar16 = 3;
  dVar1 = (this->q_element_abs_rot).m_data[0];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1;
  dVar2 = (this->q_element_abs_rot).m_data[2];
  dVar3 = (this->q_element_abs_rot).m_data[1];
  dVar4 = (this->q_element_abs_rot).m_data[3];
  peVar6 = (((this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  dVar1 = dVar1 * dVar1;
  auVar9._8_8_ = 0x8000000000000000;
  auVar9._0_8_ = 0x8000000000000000;
  auVar20 = vxorpd_avx512vl(auVar23,auVar9);
  dVar5 = *(double *)&peVar6->field_0xa8;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)&peVar6->field_0xa0;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)&peVar6->field_0xb0;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar1 + dVar2 * dVar2;
  auVar9 = vfmadd213sd_fma(auVar54,auVar38,auVar24);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar1 + dVar3 * dVar3;
  auVar23 = vfmadd213sd_fma(auVar42,auVar38,auVar24);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1 + dVar4 * dVar4;
  auVar34 = vfmadd213sd_fma(auVar34,auVar38,auVar24);
  dVar21 = auVar20._0_8_;
  dVar8 = dVar3 * dVar2 - dVar4 * dVar21;
  dVar1 = dVar3 * dVar2 + dVar4 * dVar21;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1 + dVar1;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar5 * auVar9._0_8_;
  auVar9 = vfmadd231sd_fma(auVar55,auVar66,auVar20);
  dVar22 = dVar2 * dVar4 - dVar3 * dVar21;
  dVar1 = dVar3 * dVar21 + dVar2 * dVar4;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar5 * (dVar8 + dVar8);
  auVar23 = vfmadd231sd_fma(auVar62,auVar66,auVar23);
  dVar8 = dVar2 * dVar21 + dVar3 * dVar4;
  dVar2 = dVar3 * dVar4 - dVar2 * dVar21;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar22 + dVar22;
  auVar9 = vfmadd213sd_fma(auVar24,auVar70,auVar9);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar2 + dVar2;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar5 * (dVar1 + dVar1);
  auVar20 = vfmadd231sd_fma(auVar50,auVar66,auVar38);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar8 + dVar8;
  auVar23 = vfmadd213sd_fma(auVar43,auVar70,auVar23);
  auVar34 = vfmadd213sd_fma(auVar34,auVar70,auVar20);
  local_58 = auVar23._0_8_;
  local_50 = auVar9._0_8_;
  local_48 = auVar34._0_8_;
  if (((ulong)pdVar18 & 7) == 0) {
    uVar13 = -((uint)((ulong)pdVar18 >> 3) & 0x1fffffff) & 7;
    if (uVar13 < 3) {
      uVar16 = uVar13;
    }
    if (uVar13 != 0) goto LAB_0065c437;
  }
  else {
LAB_0065c437:
    memcpy(pdVar18,&local_58,(ulong)(uVar16 * 8));
  }
  if (uVar16 < 3) {
    uVar17 = (ulong)(uVar16 << 3);
    memcpy((void *)((long)pdVar18 + uVar17),(void *)((long)&local_58 + uVar17),0x18 - uVar17);
  }
  ChFrameMoving<double>::GetWvel_par
            ((ChFrameMoving<double> *)((long)&peVar6->super_ChNodeFEAbase + 0x18));
  dVar1 = (this->q_element_abs_rot).m_data[0];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1;
  dVar2 = (this->q_element_abs_rot).m_data[2];
  dVar3 = (this->q_element_abs_rot).m_data[1];
  dVar4 = (this->q_element_abs_rot).m_data[3];
  auVar34 = ZEXT816(0xbff0000000000000);
  auVar24 = ZEXT816(0x4000000000000000);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_40;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_30;
  dVar1 = dVar1 * dVar1;
  auVar10._8_8_ = 0x8000000000000000;
  auVar10._0_8_ = 0x8000000000000000;
  auVar20 = vxorpd_avx512vl(auVar25,auVar10);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar1 + dVar2 * dVar2;
  auVar9 = vfmadd213sd_fma(auVar56,auVar24,auVar34);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar1 + dVar3 * dVar3;
  auVar23 = vfmadd213sd_fma(auVar44,auVar24,auVar34);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar1 + dVar4 * dVar4;
  auVar34 = vfmadd213sd_fma(auVar39,auVar24,auVar34);
  dVar22 = auVar20._0_8_;
  dVar5 = dVar3 * dVar2 - dVar4 * dVar22;
  dVar1 = dVar3 * dVar2 + dVar4 * dVar22;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar1 + dVar1;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_38 * auVar9._0_8_;
  auVar9 = vfmadd231sd_fma(auVar57,auVar67,auVar26);
  dVar8 = dVar2 * dVar4 - dVar3 * dVar22;
  dVar1 = dVar3 * dVar22 + dVar2 * dVar4;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_38 * (dVar5 + dVar5);
  auVar23 = vfmadd231sd_fma(auVar63,auVar67,auVar23);
  dVar5 = dVar2 * dVar22 + dVar3 * dVar4;
  dVar2 = dVar3 * dVar4 - dVar2 * dVar22;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar8 + dVar8;
  auVar9 = vfmadd213sd_fma(auVar27,auVar71,auVar9);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar2 + dVar2;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_38 * (dVar1 + dVar1);
  auVar20 = vfmadd231sd_fma(auVar51,auVar67,auVar35);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar5 + dVar5;
  auVar23 = vfmadd213sd_fma(auVar45,auVar71,auVar23);
  auVar34 = vfmadd213sd_fma(auVar34,auVar71,auVar20);
  local_58 = auVar23._0_8_;
  local_50 = auVar9._0_8_;
  local_48 = auVar34._0_8_;
  uVar17 = (mD_dt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar17 < 6) goto LAB_0065c8df;
  pdVar7 = (mD_dt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar16 = 3;
  pdVar18 = pdVar7 + 3;
  if (((ulong)pdVar18 & 7) == 0) {
    uVar13 = -((uint)((ulong)pdVar18 >> 3) & 0x1fffffff) & 7;
    if (uVar13 < 3) {
      uVar16 = uVar13;
    }
    if (uVar13 != 0) goto LAB_0065c5b6;
  }
  else {
LAB_0065c5b6:
    memcpy(pdVar18,&local_58,(ulong)(uVar16 * 8));
  }
  if (uVar16 < 3) {
    uVar19 = (ulong)(uVar16 << 3);
    memcpy((void *)((long)pdVar7 + uVar19 + 0x18),(void *)((long)&local_58 + uVar19),0x18 - uVar19);
  }
  dVar1 = (this->q_element_abs_rot).m_data[0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1;
  dVar2 = (this->q_element_abs_rot).m_data[2];
  dVar3 = (this->q_element_abs_rot).m_data[1];
  dVar4 = (this->q_element_abs_rot).m_data[3];
  auVar34 = ZEXT816(0xbff0000000000000);
  auVar24 = ZEXT816(0x4000000000000000);
  peVar6 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar1 = dVar1 * dVar1;
  auVar11._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = 0x8000000000000000;
  auVar20 = vxorpd_avx512vl(auVar28,auVar11);
  dVar5 = *(double *)&peVar6->field_0xa8;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)&peVar6->field_0xa0;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)&peVar6->field_0xb0;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar1 + dVar2 * dVar2;
  auVar9 = vfmadd213sd_fma(auVar58,auVar24,auVar34);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar1 + dVar3 * dVar3;
  auVar23 = vfmadd213sd_fma(auVar46,auVar24,auVar34);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar1 + dVar4 * dVar4;
  auVar34 = vfmadd213sd_fma(auVar36,auVar24,auVar34);
  dVar21 = auVar20._0_8_;
  dVar8 = dVar3 * dVar2 - dVar4 * dVar21;
  dVar1 = dVar3 * dVar2 + dVar4 * dVar21;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar1 + dVar1;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar5 * auVar9._0_8_;
  auVar9 = vfmadd231sd_fma(auVar59,auVar68,auVar29);
  dVar22 = dVar2 * dVar4 - dVar3 * dVar21;
  dVar1 = dVar3 * dVar21 + dVar2 * dVar4;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar5 * (dVar8 + dVar8);
  auVar23 = vfmadd231sd_fma(auVar64,auVar68,auVar23);
  dVar8 = dVar2 * dVar21 + dVar3 * dVar4;
  dVar2 = dVar3 * dVar4 - dVar2 * dVar21;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar22 + dVar22;
  auVar9 = vfmadd213sd_fma(auVar30,auVar72,auVar9);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar2 + dVar2;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar5 * (dVar1 + dVar1);
  auVar20 = vfmadd231sd_fma(auVar52,auVar68,auVar40);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar8 + dVar8;
  auVar23 = vfmadd213sd_fma(auVar47,auVar72,auVar23);
  auVar34 = vfmadd213sd_fma(auVar34,auVar72,auVar20);
  local_58 = auVar23._0_8_;
  local_50 = auVar9._0_8_;
  local_48 = auVar34._0_8_;
  if (uVar17 < 9) goto LAB_0065c8df;
  pdVar18 = pdVar7 + 6;
  uVar16 = 3;
  if (((ulong)pdVar18 & 7) == 0) {
    uVar13 = -((uint)((ulong)pdVar18 >> 3) & 0x1fffffff) & 7;
    if (uVar13 < 3) {
      uVar16 = uVar13;
    }
    if (uVar13 != 0) goto LAB_0065c72b;
  }
  else {
LAB_0065c72b:
    memcpy(pdVar18,&local_58,(ulong)(uVar16 * 8));
  }
  if (uVar16 < 3) {
    uVar17 = (ulong)(uVar16 << 3);
    memcpy((void *)((long)pdVar7 + uVar17 + 0x30),(void *)((long)&local_58 + uVar17),0x18 - uVar17);
  }
  ChFrameMoving<double>::GetWvel_par
            ((ChFrameMoving<double> *)((long)&peVar6->super_ChNodeFEAbase + 0x18));
  dVar1 = (this->q_element_abs_rot).m_data[0];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1;
  dVar2 = (this->q_element_abs_rot).m_data[2];
  dVar3 = (this->q_element_abs_rot).m_data[1];
  dVar4 = (this->q_element_abs_rot).m_data[3];
  auVar34 = ZEXT816(0xbff0000000000000);
  auVar24 = ZEXT816(0x4000000000000000);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = local_40;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = local_30;
  dVar1 = dVar1 * dVar1;
  auVar12._8_8_ = 0x8000000000000000;
  auVar12._0_8_ = 0x8000000000000000;
  auVar20 = vxorpd_avx512vl(auVar31,auVar12);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar1 + dVar2 * dVar2;
  auVar9 = vfmadd213sd_fma(auVar60,auVar24,auVar34);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar1 + dVar3 * dVar3;
  auVar23 = vfmadd213sd_fma(auVar48,auVar24,auVar34);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar1 + dVar4 * dVar4;
  auVar34 = vfmadd213sd_fma(auVar41,auVar24,auVar34);
  dVar22 = auVar20._0_8_;
  dVar5 = dVar3 * dVar2 - dVar4 * dVar22;
  dVar1 = dVar3 * dVar2 + dVar4 * dVar22;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1 + dVar1;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_38 * auVar9._0_8_;
  auVar9 = vfmadd231sd_fma(auVar61,auVar69,auVar32);
  dVar8 = dVar2 * dVar4 - dVar3 * dVar22;
  dVar1 = dVar3 * dVar22 + dVar2 * dVar4;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_38 * (dVar5 + dVar5);
  auVar23 = vfmadd231sd_fma(auVar65,auVar69,auVar23);
  dVar5 = dVar2 * dVar22 + dVar3 * dVar4;
  dVar2 = dVar3 * dVar4 - dVar2 * dVar22;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar8 + dVar8;
  auVar9 = vfmadd213sd_fma(auVar33,auVar73,auVar9);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar2 + dVar2;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_38 * (dVar1 + dVar1);
  auVar20 = vfmadd231sd_fma(auVar53,auVar69,auVar37);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar5 + dVar5;
  auVar23 = vfmadd213sd_fma(auVar49,auVar73,auVar23);
  auVar34 = vfmadd213sd_fma(auVar34,auVar73,auVar20);
  local_58 = auVar23._0_8_;
  local_50 = auVar9._0_8_;
  local_48 = auVar34._0_8_;
  if ((mD_dt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 0xc
     ) {
LAB_0065c8df:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar7 = (mD_dt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar16 = 3;
  pdVar18 = pdVar7 + 9;
  if (((ulong)pdVar18 & 7) == 0) {
    uVar13 = -((uint)((ulong)pdVar18 >> 3) & 0x1fffffff) & 7;
    if (uVar13 < 3) {
      uVar16 = uVar13;
    }
    if (uVar13 == 0) goto LAB_0065c8b1;
  }
  memcpy(pdVar18,&local_58,(ulong)(uVar16 * 8));
LAB_0065c8b1:
  if (uVar16 < 3) {
    uVar17 = (ulong)(uVar16 << 3);
    memcpy((void *)((long)pdVar7 + uVar17 + 0x48),(void *)((long)&local_58 + uVar17),0x18 - uVar17);
  }
  return;
}

Assistant:

void ChElementBeamEuler::GetField_dt(ChVectorDynamic<>& mD_dt) {
    mD_dt.resize(12);

    // Node 0, velocity (in local element frame, corotated back by A' )
    mD_dt.segment(0, 3) = q_element_abs_rot.RotateBack(nodes[0]->Frame().GetPos_dt()).eigen();

    // Node 0, x,y,z ang.velocity (in local element frame, corotated back by A' )
    mD_dt.segment(3, 3) = q_element_abs_rot.RotateBack(nodes[0]->Frame().GetWvel_par()).eigen();

    // Node 1, velocity (in local element frame, corotated back by A' )
    mD_dt.segment(6, 3) = q_element_abs_rot.RotateBack(nodes[1]->Frame().GetPos_dt()).eigen();

    // Node 1, x,y,z ang.velocity (in local element frame, corotated back by A' )
    mD_dt.segment(9, 3) = q_element_abs_rot.RotateBack(nodes[1]->Frame().GetWvel_par()).eigen();
}